

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# space2.cpp
# Opt level: O2

void bullet_done_proc(Am_Object *cmd)

{
  Am_Value *pAVar1;
  Am_Object AStack_38;
  Am_Object local_30;
  Am_Object_Method local_28;
  
  pAVar1 = (Am_Value *)Am_Object::Get(0xa218,0xca);
  Am_Object_Method::Am_Object_Method(&local_28,pAVar1);
  Am_Object::Am_Object(&local_30,cmd);
  (*local_28.Call)((Am_Object_Data *)&local_30);
  Am_Object::~Am_Object(&local_30);
  pAVar1 = (Am_Value *)Am_Object::Get((ushort)cmd,0x193);
  Am_Object::Am_Object(&AStack_38,pAVar1);
  blot_bullet(&AStack_38);
  Am_Object::~Am_Object(&AStack_38);
  return;
}

Assistant:

Am_Define_Method(Am_Object_Method, void, bullet_done, (Am_Object cmd))
{
  Am_Object_Method(Am_Animator.Get(Am_DO_METHOD)).Call(cmd);
  blot_bullet(cmd.Get(Am_OPERATES_ON));
}